

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

token_type __thiscall
nlohmann::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
::lexer::scan(lexer *this)

{
  token_type tVar1;
  byte *pbVar2;
  byte bVar3;
  byte *pbVar4;
  token_type tVar5;
  bool bVar6;
  
  pbVar4 = this->m_cursor;
  while( true ) {
    this->m_marker = (lexer_char_t *)0x0;
    this->m_start = pbVar4;
    if (pbVar4 == (byte *)0x0) {
      __assert_fail("m_start != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/NikitaEvs[P]WildHack/thirdparty/json/json.hpp"
                    ,0x25b7,
                    "token_type nlohmann::basic_json<>::lexer::scan() [ObjectType = std::map, ArrayType = std::vector, StringType = std::basic_string<char>, BooleanType = bool, NumberIntegerType = long, NumberUnsignedType = unsigned long, NumberFloatType = double, AllocatorType = std::allocator, JSONSerializer = nlohmann::adl_serializer]"
                   );
    }
    if ((long)this->m_limit - (long)pbVar4 < 5) {
      fill_line_buffer(this,5);
      pbVar4 = this->m_cursor;
    }
    bVar3 = *pbVar4;
    if ((""[bVar3] & 0x20) == 0) break;
    do {
      pbVar4 = pbVar4 + 1;
      this->m_cursor = pbVar4;
      if (this->m_limit <= pbVar4) {
        fill_line_buffer(this,1);
        pbVar4 = this->m_cursor;
      }
    } while ((""[*pbVar4] & 0x20) != 0);
  }
  tVar5 = parse_error;
  if (bVar3 < 0x5c) {
    if (bVar3 < 0x2e) {
      if (bVar3 < 0x23) {
        if (bVar3 == 0) {
          tVar5 = end_of_input;
        }
        else if (bVar3 == 0x22) {
          pbVar2 = pbVar4 + 1;
          this->m_cursor = pbVar2;
          this->m_marker = pbVar2;
          bVar3 = pbVar4[1];
          if ((bVar3 < 0x20) || (0x32 < (byte)(bVar3 + 0x3e) && (char)bVar3 < '\0'))
          goto LAB_0012dbd2;
LAB_0012d614:
          if (-1 < (char)""[bVar3]) {
            if (bVar3 < 0xe1) {
              if (bVar3 < 0x5d) {
                if (bVar3 < 0x20) goto LAB_0012d958;
                pbVar2 = pbVar2 + 1;
                tVar5 = value_string;
                if (bVar3 < 0x23) goto LAB_0012dbce;
                this->m_cursor = pbVar2;
                if (this->m_limit <= pbVar2) {
                  fill_line_buffer(this,1);
                  pbVar2 = this->m_cursor;
                }
                bVar3 = *pbVar2;
                if (bVar3 < 0x66) {
                  if (bVar3 < 0x30) {
                    if ((bVar3 != 0x22) && (bVar3 != 0x2f)) goto LAB_0012d958;
                  }
                  else {
                    if (0x5c < bVar3) {
                      if (bVar3 == 0x62) goto LAB_0012d7e9;
                      goto LAB_0012d958;
                    }
                    if (bVar3 != 0x5c) goto LAB_0012d958;
                  }
                }
                else if (bVar3 < 0x72) {
                  if ((bVar3 & 0x77) != 0x66) goto LAB_0012d958;
                }
                else if (bVar3 < 0x74) {
                  if (bVar3 != 0x72) goto LAB_0012d958;
                }
                else if (bVar3 != 0x74) {
                  if (0x75 < bVar3) goto LAB_0012d958;
                  pbVar2 = pbVar2 + 1;
                  this->m_cursor = pbVar2;
                  if (this->m_limit <= pbVar2) {
                    fill_line_buffer(this,1);
                    pbVar2 = this->m_cursor;
                  }
                  bVar3 = *pbVar2;
                  if (bVar3 < 0x41) {
                    if (9 < (byte)(bVar3 - 0x30)) goto LAB_0012d958;
                  }
                  else if (5 < (byte)(bVar3 + 0x9f) && 0x46 < bVar3) goto LAB_0012d958;
                  pbVar2 = pbVar2 + 1;
                  this->m_cursor = pbVar2;
                  if (this->m_limit <= pbVar2) {
                    fill_line_buffer(this,1);
                    pbVar2 = this->m_cursor;
                  }
                  bVar3 = *pbVar2;
                  if (bVar3 < 0x41) {
                    if (9 < (byte)(bVar3 - 0x30)) goto LAB_0012d958;
                  }
                  else if (5 < (byte)(bVar3 + 0x9f) && 0x46 < bVar3) goto LAB_0012d958;
                  pbVar2 = pbVar2 + 1;
                  this->m_cursor = pbVar2;
                  if (this->m_limit <= pbVar2) {
                    fill_line_buffer(this,1);
                    pbVar2 = this->m_cursor;
                  }
                  bVar3 = *pbVar2;
                  if (bVar3 < 0x41) {
                    if (9 < (byte)(bVar3 - 0x30)) goto LAB_0012d958;
                  }
                  else if (0x46 < bVar3 && 5 < (byte)(bVar3 + 0x9f)) goto LAB_0012d958;
                  pbVar2 = pbVar2 + 1;
                  this->m_cursor = pbVar2;
                  if (this->m_limit <= pbVar2) {
                    fill_line_buffer(this,1);
                    pbVar2 = this->m_cursor;
                  }
                  bVar3 = *pbVar2;
                  if (bVar3 < 0x41) {
                    if (9 < (byte)(bVar3 - 0x30)) goto LAB_0012d958;
                  }
                  else if (5 < (byte)(bVar3 + 0x9f) && 0x46 < bVar3) goto LAB_0012d958;
                }
                goto LAB_0012d7e9;
              }
              if (bVar3 < 0xc2) goto LAB_0012d958;
              if (bVar3 == 0xe0) {
                pbVar2 = pbVar2 + 1;
                this->m_cursor = pbVar2;
                if (this->m_limit <= pbVar2) {
                  fill_line_buffer(this,1);
                  pbVar2 = this->m_cursor;
                }
                if ((*pbVar2 & 0xe0) != 0xa0) goto LAB_0012d958;
              }
            }
            else {
              if (bVar3 < 0xf0) {
                if (bVar3 == 0xed) {
                  pbVar2 = pbVar2 + 1;
                  this->m_cursor = pbVar2;
                  if (this->m_limit <= pbVar2) {
                    fill_line_buffer(this,1);
                    pbVar2 = this->m_cursor;
                  }
                  if ((char)*pbVar2 < -0x60) goto LAB_0012d7c4;
                  goto LAB_0012d958;
                }
              }
              else if (bVar3 == 0xf0) {
                pbVar2 = pbVar2 + 1;
                this->m_cursor = pbVar2;
                if (this->m_limit <= pbVar2) {
                  fill_line_buffer(this,1);
                  pbVar2 = this->m_cursor;
                }
                if (0x2f < (byte)(*pbVar2 + 0x70)) goto LAB_0012d958;
              }
              else if (bVar3 < 0xf4) {
                pbVar2 = pbVar2 + 1;
                this->m_cursor = pbVar2;
                if (this->m_limit <= pbVar2) {
                  fill_line_buffer(this,1);
                  pbVar2 = this->m_cursor;
                }
                if (-0x41 < (char)*pbVar2) goto LAB_0012d958;
              }
              else {
                if (bVar3 != 0xf4) goto LAB_0012d958;
                pbVar2 = pbVar2 + 1;
                this->m_cursor = pbVar2;
                if (this->m_limit <= pbVar2) {
                  fill_line_buffer(this,1);
                  pbVar2 = this->m_cursor;
                }
                if (-0x71 < (char)*pbVar2) goto LAB_0012d958;
              }
              pbVar2 = pbVar2 + 1;
              this->m_cursor = pbVar2;
              if (this->m_limit <= pbVar2) {
                fill_line_buffer(this,1);
                pbVar2 = this->m_cursor;
              }
              if (-0x41 < (char)*pbVar2) goto LAB_0012d958;
            }
LAB_0012d7c4:
            pbVar2 = pbVar2 + 1;
            this->m_cursor = pbVar2;
            if (this->m_limit <= pbVar2) {
              fill_line_buffer(this,1);
              pbVar2 = this->m_cursor;
            }
            if (-0x41 < (char)*pbVar2) goto LAB_0012d958;
          }
LAB_0012d7e9:
          pbVar2 = pbVar2 + 1;
          this->m_cursor = pbVar2;
          if (this->m_limit <= pbVar2) {
            fill_line_buffer(this,1);
            pbVar2 = this->m_cursor;
          }
          bVar3 = *pbVar2;
          goto LAB_0012d614;
        }
      }
      else if (0x2b < bVar3) {
        pbVar4 = pbVar4 + 1;
        this->m_cursor = pbVar4;
        if (bVar3 != 0x2d) {
          tVar5 = value_separator;
          goto LAB_0012dbd2;
        }
        bVar3 = *pbVar4;
        if (bVar3 < 0x30) goto LAB_0012dbd2;
        if (bVar3 != 0x30) {
          if (0x39 < bVar3) goto LAB_0012dbd2;
          goto LAB_0012da4c;
        }
LAB_0012d99b:
        pbVar2 = pbVar4 + 1;
        this->m_cursor = pbVar2;
        this->m_marker = pbVar2;
        bVar3 = pbVar4[1];
        pbVar4 = pbVar2;
        if (0x44 < bVar3) goto joined_r0x0012dbf5;
joined_r0x0012da89:
        if (bVar3 == 0x2e) {
          pbVar2 = pbVar4 + 1;
          this->m_cursor = pbVar2;
          if (9 < (byte)(pbVar4[1] - 0x30)) goto LAB_0012dc24;
          do {
            pbVar2 = pbVar2 + 1;
            this->m_cursor = pbVar2;
            this->m_marker = pbVar2;
            if ((long)this->m_limit - (long)pbVar2 < 3) {
              fill_line_buffer(this,3);
              pbVar2 = this->m_cursor;
            }
            bVar3 = *pbVar2;
            if (0x44 < bVar3) goto joined_r0x0012dbf5;
          } while ((byte)(bVar3 - 0x30) < 10);
        }
        goto LAB_0012dc5d;
      }
    }
    else if (bVar3 < 0x3a) {
      if (0x2f < bVar3) {
        if (bVar3 == 0x30) goto LAB_0012d99b;
LAB_0012da4c:
        do {
          pbVar4 = pbVar4 + 1;
          this->m_cursor = pbVar4;
          this->m_marker = pbVar4;
          if ((long)this->m_limit - (long)pbVar4 < 3) {
            fill_line_buffer(this,3);
            pbVar4 = this->m_cursor;
          }
          bVar3 = *pbVar4;
        } while ((""[bVar3] & 0x40) != 0);
        pbVar2 = pbVar4;
        if (bVar3 < 0x45) goto joined_r0x0012da89;
joined_r0x0012dbf5:
        if ((bVar3 & 0xdf) != 0x45) goto LAB_0012dc5d;
        pbVar4 = pbVar2 + 1;
        this->m_cursor = pbVar4;
        bVar3 = pbVar2[1];
        if (bVar3 < 0x2d) {
          if (bVar3 == 0x2b) goto LAB_0012dc13;
LAB_0012dc24:
          pbVar2 = this->m_marker;
          tVar5 = value_number;
          goto LAB_0012dbce;
        }
        if (bVar3 == 0x2d) {
LAB_0012dc13:
          pbVar4 = pbVar2 + 2;
          this->m_cursor = pbVar4;
          if ((byte)(pbVar2[2] - 0x3a) < 0xf6) goto LAB_0012dc24;
        }
        else if (9 < (byte)(bVar3 - 0x30)) goto LAB_0012dc24;
        do {
          pbVar4 = pbVar4 + 1;
          this->m_cursor = pbVar4;
          if (this->m_limit <= pbVar4) {
            fill_line_buffer(this,1);
            pbVar4 = this->m_cursor;
          }
        } while ((byte)(*pbVar4 - 0x30) < 10);
LAB_0012dc5d:
        tVar5 = value_number;
        goto LAB_0012dbd2;
      }
    }
    else if (bVar3 == 0x3a) {
      tVar5 = name_separator;
    }
    else if (bVar3 == 0x5b) {
      tVar5 = begin_array;
    }
LAB_0012dbcb:
    pbVar2 = pbVar4 + 1;
  }
  else {
    if (0x6e < bVar3) {
      if (bVar3 < 0x7b) {
        if (bVar3 == 0x74) {
          pbVar2 = pbVar4 + 1;
          this->m_cursor = pbVar2;
          this->m_marker = pbVar2;
          if (pbVar4[1] != 0x72) goto LAB_0012dbd2;
          this->m_cursor = pbVar4 + 2;
          if (pbVar4[2] == 0x75) {
            this->m_cursor = pbVar4 + 3;
            bVar6 = pbVar4[3] == 0x65;
            if (bVar6) {
              pbVar2 = pbVar4 + 4;
            }
            tVar1 = literal_true;
            goto LAB_0012dbb8;
          }
          goto LAB_0012dbce;
        }
      }
      else if (bVar3 == 0x7b) {
        tVar5 = begin_object;
      }
      else if (bVar3 == 0x7d) {
        tVar5 = end_object;
      }
      goto LAB_0012dbcb;
    }
    if (bVar3 < 0x66) {
      if (bVar3 == 0x5d) {
        tVar5 = end_array;
      }
      goto LAB_0012dbcb;
    }
    if (bVar3 == 0x66) {
      pbVar2 = pbVar4 + 1;
      this->m_cursor = pbVar2;
      this->m_marker = pbVar2;
      if (pbVar4[1] != 0x61) goto LAB_0012dbd2;
      this->m_cursor = pbVar4 + 2;
      if ((pbVar4[2] == 0x6c) && (this->m_cursor = pbVar4 + 3, pbVar4[3] == 0x73)) {
        this->m_cursor = pbVar4 + 4;
        bVar6 = pbVar4[4] == 0x65;
        if (bVar6) {
          pbVar2 = pbVar4 + 5;
        }
        tVar1 = literal_false;
LAB_0012dbb8:
        if (bVar6) {
          tVar5 = tVar1;
        }
      }
    }
    else {
      if (bVar3 != 0x6e) goto LAB_0012dbcb;
      pbVar2 = pbVar4 + 1;
      this->m_cursor = pbVar2;
      this->m_marker = pbVar2;
      if (pbVar4[1] != 0x75) goto LAB_0012dbd2;
      this->m_cursor = pbVar4 + 2;
      if (pbVar4[2] == 0x6c) {
        this->m_cursor = pbVar4 + 3;
        if (pbVar4[3] == 0x6c) {
          pbVar2 = pbVar4 + 4;
        }
        tVar5 = (uint)(pbVar4[3] != 0x6c) * 9 + literal_null;
      }
    }
  }
LAB_0012dbce:
  this->m_cursor = pbVar2;
LAB_0012dbd2:
  this->last_token_type = tVar5;
  return tVar5;
LAB_0012d958:
  pbVar2 = this->m_marker;
  tVar5 = parse_error;
  goto LAB_0012dbce;
}

Assistant:

token_type scan()
        {
            while (true)
            {
                // pointer for backtracking information
                m_marker = nullptr;

                // remember the begin of the token
                m_start = m_cursor;
                assert(m_start != nullptr);


                {
                    lexer_char_t yych;
                    unsigned int yyaccept = 0;
                    static const unsigned char yybm[] =
                    {
                        0,   0,   0,   0,   0,   0,   0,   0,
                        0,  32,  32,   0,   0,  32,   0,   0,
                        0,   0,   0,   0,   0,   0,   0,   0,
                        0,   0,   0,   0,   0,   0,   0,   0,
                        160, 128,   0, 128, 128, 128, 128, 128,
                        128, 128, 128, 128, 128, 128, 128, 128,
                        192, 192, 192, 192, 192, 192, 192, 192,
                        192, 192, 128, 128, 128, 128, 128, 128,
                        128, 128, 128, 128, 128, 128, 128, 128,
                        128, 128, 128, 128, 128, 128, 128, 128,
                        128, 128, 128, 128, 128, 128, 128, 128,
                        128, 128, 128, 128,   0, 128, 128, 128,
                        128, 128, 128, 128, 128, 128, 128, 128,
                        128, 128, 128, 128, 128, 128, 128, 128,
                        128, 128, 128, 128, 128, 128, 128, 128,
                        128, 128, 128, 128, 128, 128, 128, 128,
                        0,   0,   0,   0,   0,   0,   0,   0,
                        0,   0,   0,   0,   0,   0,   0,   0,
                        0,   0,   0,   0,   0,   0,   0,   0,
                        0,   0,   0,   0,   0,   0,   0,   0,
                        0,   0,   0,   0,   0,   0,   0,   0,
                        0,   0,   0,   0,   0,   0,   0,   0,
                        0,   0,   0,   0,   0,   0,   0,   0,
                        0,   0,   0,   0,   0,   0,   0,   0,
                        0,   0,   0,   0,   0,   0,   0,   0,
                        0,   0,   0,   0,   0,   0,   0,   0,
                        0,   0,   0,   0,   0,   0,   0,   0,
                        0,   0,   0,   0,   0,   0,   0,   0,
                        0,   0,   0,   0,   0,   0,   0,   0,
                        0,   0,   0,   0,   0,   0,   0,   0,
                        0,   0,   0,   0,   0,   0,   0,   0,
                        0,   0,   0,   0,   0,   0,   0,   0,
                    };
                    if ((m_limit - m_cursor) < 5)
                    {
                        fill_line_buffer(5);    // LCOV_EXCL_LINE
                    }
                    yych = *m_cursor;
                    if (yybm[0 + yych] & 32)
                    {
                        goto basic_json_parser_6;
                    }
                    if (yych <= '[')
                    {
                        if (yych <= '-')
                        {
                            if (yych <= '"')
                            {
                                if (yych <= 0x00)
                                {
                                    goto basic_json_parser_2;
                                }
                                if (yych <= '!')
                                {
                                    goto basic_json_parser_4;
                                }
                                goto basic_json_parser_9;
                            }
                            else
                            {
                                if (yych <= '+')
                                {
                                    goto basic_json_parser_4;
                                }
                                if (yych <= ',')
                                {
                                    goto basic_json_parser_10;
                                }
                                goto basic_json_parser_12;
                            }
                        }
                        else
                        {
                            if (yych <= '9')
                            {
                                if (yych <= '/')
                                {
                                    goto basic_json_parser_4;
                                }
                                if (yych <= '0')
                                {
                                    goto basic_json_parser_13;
                                }
                                goto basic_json_parser_15;
                            }
                            else
                            {
                                if (yych <= ':')
                                {
                                    goto basic_json_parser_17;
                                }
                                if (yych <= 'Z')
                                {
                                    goto basic_json_parser_4;
                                }
                                goto basic_json_parser_19;
                            }
                        }
                    }
                    else
                    {
                        if (yych <= 'n')
                        {
                            if (yych <= 'e')
                            {
                                if (yych == ']')
                                {
                                    goto basic_json_parser_21;
                                }
                                goto basic_json_parser_4;
                            }
                            else
                            {
                                if (yych <= 'f')
                                {
                                    goto basic_json_parser_23;
                                }
                                if (yych <= 'm')
                                {
                                    goto basic_json_parser_4;
                                }
                                goto basic_json_parser_24;
                            }
                        }
                        else
                        {
                            if (yych <= 'z')
                            {
                                if (yych == 't')
                                {
                                    goto basic_json_parser_25;
                                }
                                goto basic_json_parser_4;
                            }
                            else
                            {
                                if (yych <= '{')
                                {
                                    goto basic_json_parser_26;
                                }
                                if (yych == '}')
                                {
                                    goto basic_json_parser_28;
                                }
                                goto basic_json_parser_4;
                            }
                        }
                    }
basic_json_parser_2:
                    ++m_cursor;
                    {
                        last_token_type = token_type::end_of_input;
                        break;
                    }
basic_json_parser_4:
                    ++m_cursor;
basic_json_parser_5:
                    {
                        last_token_type = token_type::parse_error;
                        break;
                    }
basic_json_parser_6:
                    ++m_cursor;
                    if (m_limit <= m_cursor)
                    {
                        fill_line_buffer(1);    // LCOV_EXCL_LINE
                    }
                    yych = *m_cursor;
                    if (yybm[0 + yych] & 32)
                    {
                        goto basic_json_parser_6;
                    }
                    {
                        continue;
                    }
basic_json_parser_9:
                    yyaccept = 0;
                    yych = *(m_marker = ++m_cursor);
                    if (yych <= 0x1F)
                    {
                        goto basic_json_parser_5;
                    }
                    if (yych <= 0x7F)
                    {
                        goto basic_json_parser_31;
                    }
                    if (yych <= 0xC1)
                    {
                        goto basic_json_parser_5;
                    }
                    if (yych <= 0xF4)
                    {
                        goto basic_json_parser_31;
                    }
                    goto basic_json_parser_5;
basic_json_parser_10:
                    ++m_cursor;
                    {
                        last_token_type = token_type::value_separator;
                        break;
                    }
basic_json_parser_12:
                    yych = *++m_cursor;
                    if (yych <= '/')
                    {
                        goto basic_json_parser_5;
                    }
                    if (yych <= '0')
                    {
                        goto basic_json_parser_13;
                    }
                    if (yych <= '9')
                    {
                        goto basic_json_parser_15;
                    }
                    goto basic_json_parser_5;
basic_json_parser_13:
                    yyaccept = 1;
                    yych = *(m_marker = ++m_cursor);
                    if (yych <= 'D')
                    {
                        if (yych == '.')
                        {
                            goto basic_json_parser_43;
                        }
                    }
                    else
                    {
                        if (yych <= 'E')
                        {
                            goto basic_json_parser_44;
                        }
                        if (yych == 'e')
                        {
                            goto basic_json_parser_44;
                        }
                    }
basic_json_parser_14:
                    {
                        last_token_type = token_type::value_number;
                        break;
                    }
basic_json_parser_15:
                    yyaccept = 1;
                    m_marker = ++m_cursor;
                    if ((m_limit - m_cursor) < 3)
                    {
                        fill_line_buffer(3);    // LCOV_EXCL_LINE
                    }
                    yych = *m_cursor;
                    if (yybm[0 + yych] & 64)
                    {
                        goto basic_json_parser_15;
                    }
                    if (yych <= 'D')
                    {
                        if (yych == '.')
                        {
                            goto basic_json_parser_43;
                        }
                        goto basic_json_parser_14;
                    }
                    else
                    {
                        if (yych <= 'E')
                        {
                            goto basic_json_parser_44;
                        }
                        if (yych == 'e')
                        {
                            goto basic_json_parser_44;
                        }
                        goto basic_json_parser_14;
                    }
basic_json_parser_17:
                    ++m_cursor;
                    {
                        last_token_type = token_type::name_separator;
                        break;
                    }
basic_json_parser_19:
                    ++m_cursor;
                    {
                        last_token_type = token_type::begin_array;
                        break;
                    }
basic_json_parser_21:
                    ++m_cursor;
                    {
                        last_token_type = token_type::end_array;
                        break;
                    }
basic_json_parser_23:
                    yyaccept = 0;
                    yych = *(m_marker = ++m_cursor);
                    if (yych == 'a')
                    {
                        goto basic_json_parser_45;
                    }
                    goto basic_json_parser_5;
basic_json_parser_24:
                    yyaccept = 0;
                    yych = *(m_marker = ++m_cursor);
                    if (yych == 'u')
                    {
                        goto basic_json_parser_46;
                    }
                    goto basic_json_parser_5;
basic_json_parser_25:
                    yyaccept = 0;
                    yych = *(m_marker = ++m_cursor);
                    if (yych == 'r')
                    {
                        goto basic_json_parser_47;
                    }
                    goto basic_json_parser_5;
basic_json_parser_26:
                    ++m_cursor;
                    {
                        last_token_type = token_type::begin_object;
                        break;
                    }
basic_json_parser_28:
                    ++m_cursor;
                    {
                        last_token_type = token_type::end_object;
                        break;
                    }
basic_json_parser_30:
                    ++m_cursor;
                    if (m_limit <= m_cursor)
                    {
                        fill_line_buffer(1);    // LCOV_EXCL_LINE
                    }
                    yych = *m_cursor;
basic_json_parser_31:
                    if (yybm[0 + yych] & 128)
                    {
                        goto basic_json_parser_30;
                    }
                    if (yych <= 0xE0)
                    {
                        if (yych <= '\\')
                        {
                            if (yych <= 0x1F)
                            {
                                goto basic_json_parser_32;
                            }
                            if (yych <= '"')
                            {
                                goto basic_json_parser_33;
                            }
                            goto basic_json_parser_35;
                        }
                        else
                        {
                            if (yych <= 0xC1)
                            {
                                goto basic_json_parser_32;
                            }
                            if (yych <= 0xDF)
                            {
                                goto basic_json_parser_36;
                            }
                            goto basic_json_parser_37;
                        }
                    }
                    else
                    {
                        if (yych <= 0xEF)
                        {
                            if (yych == 0xED)
                            {
                                goto basic_json_parser_39;
                            }
                            goto basic_json_parser_38;
                        }
                        else
                        {
                            if (yych <= 0xF0)
                            {
                                goto basic_json_parser_40;
                            }
                            if (yych <= 0xF3)
                            {
                                goto basic_json_parser_41;
                            }
                            if (yych <= 0xF4)
                            {
                                goto basic_json_parser_42;
                            }
                        }
                    }
basic_json_parser_32:
                    m_cursor = m_marker;
                    if (yyaccept == 0)
                    {
                        goto basic_json_parser_5;
                    }
                    else
                    {
                        goto basic_json_parser_14;
                    }
basic_json_parser_33:
                    ++m_cursor;
                    {
                        last_token_type = token_type::value_string;
                        break;
                    }
basic_json_parser_35:
                    ++m_cursor;
                    if (m_limit <= m_cursor)
                    {
                        fill_line_buffer(1);    // LCOV_EXCL_LINE
                    }
                    yych = *m_cursor;
                    if (yych <= 'e')
                    {
                        if (yych <= '/')
                        {
                            if (yych == '"')
                            {
                                goto basic_json_parser_30;
                            }
                            if (yych <= '.')
                            {
                                goto basic_json_parser_32;
                            }
                            goto basic_json_parser_30;
                        }
                        else
                        {
                            if (yych <= '\\')
                            {
                                if (yych <= '[')
                                {
                                    goto basic_json_parser_32;
                                }
                                goto basic_json_parser_30;
                            }
                            else
                            {
                                if (yych == 'b')
                                {
                                    goto basic_json_parser_30;
                                }
                                goto basic_json_parser_32;
                            }
                        }
                    }
                    else
                    {
                        if (yych <= 'q')
                        {
                            if (yych <= 'f')
                            {
                                goto basic_json_parser_30;
                            }
                            if (yych == 'n')
                            {
                                goto basic_json_parser_30;
                            }
                            goto basic_json_parser_32;
                        }
                        else
                        {
                            if (yych <= 's')
                            {
                                if (yych <= 'r')
                                {
                                    goto basic_json_parser_30;
                                }
                                goto basic_json_parser_32;
                            }
                            else
                            {
                                if (yych <= 't')
                                {
                                    goto basic_json_parser_30;
                                }
                                if (yych <= 'u')
                                {
                                    goto basic_json_parser_48;
                                }
                                goto basic_json_parser_32;
                            }
                        }
                    }
basic_json_parser_36:
                    ++m_cursor;
                    if (m_limit <= m_cursor)
                    {
                        fill_line_buffer(1);    // LCOV_EXCL_LINE
                    }
                    yych = *m_cursor;
                    if (yych <= 0x7F)
                    {
                        goto basic_json_parser_32;
                    }
                    if (yych <= 0xBF)
                    {
                        goto basic_json_parser_30;
                    }
                    goto basic_json_parser_32;
basic_json_parser_37:
                    ++m_cursor;
                    if (m_limit <= m_cursor)
                    {
                        fill_line_buffer(1);    // LCOV_EXCL_LINE
                    }
                    yych = *m_cursor;
                    if (yych <= 0x9F)
                    {
                        goto basic_json_parser_32;
                    }
                    if (yych <= 0xBF)
                    {
                        goto basic_json_parser_36;
                    }
                    goto basic_json_parser_32;
basic_json_parser_38:
                    ++m_cursor;
                    if (m_limit <= m_cursor)
                    {
                        fill_line_buffer(1);    // LCOV_EXCL_LINE
                    }
                    yych = *m_cursor;
                    if (yych <= 0x7F)
                    {
                        goto basic_json_parser_32;
                    }
                    if (yych <= 0xBF)
                    {
                        goto basic_json_parser_36;
                    }
                    goto basic_json_parser_32;
basic_json_parser_39:
                    ++m_cursor;
                    if (m_limit <= m_cursor)
                    {
                        fill_line_buffer(1);    // LCOV_EXCL_LINE
                    }
                    yych = *m_cursor;
                    if (yych <= 0x7F)
                    {
                        goto basic_json_parser_32;
                    }
                    if (yych <= 0x9F)
                    {
                        goto basic_json_parser_36;
                    }
                    goto basic_json_parser_32;
basic_json_parser_40:
                    ++m_cursor;
                    if (m_limit <= m_cursor)
                    {
                        fill_line_buffer(1);    // LCOV_EXCL_LINE
                    }
                    yych = *m_cursor;
                    if (yych <= 0x8F)
                    {
                        goto basic_json_parser_32;
                    }
                    if (yych <= 0xBF)
                    {
                        goto basic_json_parser_38;
                    }
                    goto basic_json_parser_32;
basic_json_parser_41:
                    ++m_cursor;
                    if (m_limit <= m_cursor)
                    {
                        fill_line_buffer(1);    // LCOV_EXCL_LINE
                    }
                    yych = *m_cursor;
                    if (yych <= 0x7F)
                    {
                        goto basic_json_parser_32;
                    }
                    if (yych <= 0xBF)
                    {
                        goto basic_json_parser_38;
                    }
                    goto basic_json_parser_32;
basic_json_parser_42:
                    ++m_cursor;
                    if (m_limit <= m_cursor)
                    {
                        fill_line_buffer(1);    // LCOV_EXCL_LINE
                    }
                    yych = *m_cursor;
                    if (yych <= 0x7F)
                    {
                        goto basic_json_parser_32;
                    }
                    if (yych <= 0x8F)
                    {
                        goto basic_json_parser_38;
                    }
                    goto basic_json_parser_32;
basic_json_parser_43:
                    yych = *++m_cursor;
                    if (yych <= '/')
                    {
                        goto basic_json_parser_32;
                    }
                    if (yych <= '9')
                    {
                        goto basic_json_parser_49;
                    }
                    goto basic_json_parser_32;
basic_json_parser_44:
                    yych = *++m_cursor;
                    if (yych <= ',')
                    {
                        if (yych == '+')
                        {
                            goto basic_json_parser_51;
                        }
                        goto basic_json_parser_32;
                    }
                    else
                    {
                        if (yych <= '-')
                        {
                            goto basic_json_parser_51;
                        }
                        if (yych <= '/')
                        {
                            goto basic_json_parser_32;
                        }
                        if (yych <= '9')
                        {
                            goto basic_json_parser_52;
                        }
                        goto basic_json_parser_32;
                    }
basic_json_parser_45:
                    yych = *++m_cursor;
                    if (yych == 'l')
                    {
                        goto basic_json_parser_54;
                    }
                    goto basic_json_parser_32;
basic_json_parser_46:
                    yych = *++m_cursor;
                    if (yych == 'l')
                    {
                        goto basic_json_parser_55;
                    }
                    goto basic_json_parser_32;
basic_json_parser_47:
                    yych = *++m_cursor;
                    if (yych == 'u')
                    {
                        goto basic_json_parser_56;
                    }
                    goto basic_json_parser_32;
basic_json_parser_48:
                    ++m_cursor;
                    if (m_limit <= m_cursor)
                    {
                        fill_line_buffer(1);    // LCOV_EXCL_LINE
                    }
                    yych = *m_cursor;
                    if (yych <= '@')
                    {
                        if (yych <= '/')
                        {
                            goto basic_json_parser_32;
                        }
                        if (yych <= '9')
                        {
                            goto basic_json_parser_57;
                        }
                        goto basic_json_parser_32;
                    }
                    else
                    {
                        if (yych <= 'F')
                        {
                            goto basic_json_parser_57;
                        }
                        if (yych <= '`')
                        {
                            goto basic_json_parser_32;
                        }
                        if (yych <= 'f')
                        {
                            goto basic_json_parser_57;
                        }
                        goto basic_json_parser_32;
                    }
basic_json_parser_49:
                    yyaccept = 1;
                    m_marker = ++m_cursor;
                    if ((m_limit - m_cursor) < 3)
                    {
                        fill_line_buffer(3);    // LCOV_EXCL_LINE
                    }
                    yych = *m_cursor;
                    if (yych <= 'D')
                    {
                        if (yych <= '/')
                        {
                            goto basic_json_parser_14;
                        }
                        if (yych <= '9')
                        {
                            goto basic_json_parser_49;
                        }
                        goto basic_json_parser_14;
                    }
                    else
                    {
                        if (yych <= 'E')
                        {
                            goto basic_json_parser_44;
                        }
                        if (yych == 'e')
                        {
                            goto basic_json_parser_44;
                        }
                        goto basic_json_parser_14;
                    }
basic_json_parser_51:
                    yych = *++m_cursor;
                    if (yych <= '/')
                    {
                        goto basic_json_parser_32;
                    }
                    if (yych >= ':')
                    {
                        goto basic_json_parser_32;
                    }
basic_json_parser_52:
                    ++m_cursor;
                    if (m_limit <= m_cursor)
                    {
                        fill_line_buffer(1);    // LCOV_EXCL_LINE
                    }
                    yych = *m_cursor;
                    if (yych <= '/')
                    {
                        goto basic_json_parser_14;
                    }
                    if (yych <= '9')
                    {
                        goto basic_json_parser_52;
                    }
                    goto basic_json_parser_14;
basic_json_parser_54:
                    yych = *++m_cursor;
                    if (yych == 's')
                    {
                        goto basic_json_parser_58;
                    }
                    goto basic_json_parser_32;
basic_json_parser_55:
                    yych = *++m_cursor;
                    if (yych == 'l')
                    {
                        goto basic_json_parser_59;
                    }
                    goto basic_json_parser_32;
basic_json_parser_56:
                    yych = *++m_cursor;
                    if (yych == 'e')
                    {
                        goto basic_json_parser_61;
                    }
                    goto basic_json_parser_32;
basic_json_parser_57:
                    ++m_cursor;
                    if (m_limit <= m_cursor)
                    {
                        fill_line_buffer(1);    // LCOV_EXCL_LINE
                    }
                    yych = *m_cursor;
                    if (yych <= '@')
                    {
                        if (yych <= '/')
                        {
                            goto basic_json_parser_32;
                        }
                        if (yych <= '9')
                        {
                            goto basic_json_parser_63;
                        }
                        goto basic_json_parser_32;
                    }
                    else
                    {
                        if (yych <= 'F')
                        {
                            goto basic_json_parser_63;
                        }
                        if (yych <= '`')
                        {
                            goto basic_json_parser_32;
                        }
                        if (yych <= 'f')
                        {
                            goto basic_json_parser_63;
                        }
                        goto basic_json_parser_32;
                    }
basic_json_parser_58:
                    yych = *++m_cursor;
                    if (yych == 'e')
                    {
                        goto basic_json_parser_64;
                    }
                    goto basic_json_parser_32;
basic_json_parser_59:
                    ++m_cursor;
                    {
                        last_token_type = token_type::literal_null;
                        break;
                    }
basic_json_parser_61:
                    ++m_cursor;
                    {
                        last_token_type = token_type::literal_true;
                        break;
                    }
basic_json_parser_63:
                    ++m_cursor;
                    if (m_limit <= m_cursor)
                    {
                        fill_line_buffer(1);    // LCOV_EXCL_LINE
                    }
                    yych = *m_cursor;
                    if (yych <= '@')
                    {
                        if (yych <= '/')
                        {
                            goto basic_json_parser_32;
                        }
                        if (yych <= '9')
                        {
                            goto basic_json_parser_66;
                        }
                        goto basic_json_parser_32;
                    }
                    else
                    {
                        if (yych <= 'F')
                        {
                            goto basic_json_parser_66;
                        }
                        if (yych <= '`')
                        {
                            goto basic_json_parser_32;
                        }
                        if (yych <= 'f')
                        {
                            goto basic_json_parser_66;
                        }
                        goto basic_json_parser_32;
                    }
basic_json_parser_64:
                    ++m_cursor;
                    {
                        last_token_type = token_type::literal_false;
                        break;
                    }
basic_json_parser_66:
                    ++m_cursor;
                    if (m_limit <= m_cursor)
                    {
                        fill_line_buffer(1);    // LCOV_EXCL_LINE
                    }
                    yych = *m_cursor;
                    if (yych <= '@')
                    {
                        if (yych <= '/')
                        {
                            goto basic_json_parser_32;
                        }
                        if (yych <= '9')
                        {
                            goto basic_json_parser_30;
                        }
                        goto basic_json_parser_32;
                    }
                    else
                    {
                        if (yych <= 'F')
                        {
                            goto basic_json_parser_30;
                        }
                        if (yych <= '`')
                        {
                            goto basic_json_parser_32;
                        }
                        if (yych <= 'f')
                        {
                            goto basic_json_parser_30;
                        }
                        goto basic_json_parser_32;
                    }
                }

            }

            return last_token_type;
        }